

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_BOM(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yymatchString(G,anon_var_dwarf_2475);
  if (((iVar3 != 0) && (iVar3 = yymatchString(G,anon_var_dwarf_2480), iVar3 != 0)) &&
     (iVar3 = yymatchString(G,anon_var_dwarf_248b), iVar3 != 0)) {
    return 1;
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_BOM(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "BOM"));
  if (!yymatchString(G, "\357")) goto l1039;
  if (!yymatchString(G, "\273")) goto l1039;
  if (!yymatchString(G, "\277")) goto l1039;
  yyprintf((stderr, "  ok   BOM"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l1039:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "BOM"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}